

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

string * __thiscall
re2::DFA::DumpWorkq_abi_cxx11_(string *__return_storage_ptr__,DFA *this,Workq *q)

{
  char *pcVar1;
  int *piVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = "\t";
  piVar2 = *(int **)((long)&(this->mutex_).mutex_ + 0x10);
  for (piVar3 = piVar2; piVar3 != piVar2 + *(int *)&this->prog_; piVar3 = piVar3 + 1) {
    if (*piVar3 < (this->mutex_).mutex_.__data.__cur_writer) {
      StringPrintf_abi_cxx11_(&local_50,"%s%d",pcVar1 + 1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pcVar1 = "},";
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"|");
      pcVar1 = "\t";
    }
    piVar2 = *(int **)((long)&(this->mutex_).mutex_ + 0x10);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DFA::DumpWorkq(Workq* q) {
  std::string s;
  const char* sep = "";
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    if (q->is_mark(*it)) {
      s += "|";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, *it);
      sep = ",";
    }
  }
  return s;
}